

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

bool am_insert_commands_ok_proc(Am_Object *self)

{
  bool bVar1;
  unsigned_short uVar2;
  Am_Value *pAVar3;
  Am_Object script_window;
  Am_Value_List sel_list;
  Am_Object scroll_menu;
  Am_Object undo_db;
  Am_Value_List new_cmds;
  Am_Object local_40;
  Am_Value_List local_38;
  Am_Object local_28;
  Am_Object local_20;
  Am_Value_List local_18;
  
  Am_Object::Get_Object((Am_Object *)&local_18,(Am_Slot_Key)self,0x170);
  Am_Object::Get_Object(&local_40,(Am_Slot_Key)&local_18,10);
  Am_Object::~Am_Object((Am_Object *)&local_18);
  pAVar3 = Am_Object::Get(&local_40,Am_UNDO_MENU_OF_COMMANDS,0);
  Am_Object::Am_Object(&local_20,pAVar3);
  Am_Object::Get_Object((Am_Object *)&local_38,(Am_Slot_Key)&local_20,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar3 = Am_Object::Get((Am_Object *)&local_38,0x169,0);
  Am_Value_List::Am_Value_List(&local_18,pAVar3);
  Am_Object::~Am_Object((Am_Object *)&local_38);
  bVar1 = Am_Value_List::Valid(&local_18);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_0021c839;
  }
  pAVar3 = Am_Object::Get(&local_40,Am_UNDO_SCROLL_GROUP,0);
  Am_Object::Am_Object(&local_28,pAVar3);
  pAVar3 = Am_Object::Get(&local_28,0x169,0);
  Am_Value_List::Am_Value_List(&local_38,pAVar3);
  bVar1 = Am_Value_List::Valid(&local_38);
  if (bVar1) {
    uVar2 = Am_Value_List::Length(&local_38);
    if (uVar2 < 2) goto LAB_0021c823;
    bVar1 = false;
  }
  else {
LAB_0021c823:
    bVar1 = true;
  }
  Am_Value_List::~Am_Value_List(&local_38);
  Am_Object::~Am_Object(&local_28);
LAB_0021c839:
  Am_Value_List::~Am_Value_List(&local_18);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_40);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, am_insert_commands_ok)
{
  Am_Object script_window = self.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object undo_db = script_window.Get(Am_UNDO_MENU_OF_COMMANDS);
  Am_Value_List new_cmds =
      undo_db.Get_Object(Am_UNDO_SCROLL_GROUP).Get(Am_VALUE);
  if (!new_cmds.Valid())
    return false;
  Am_Object scroll_menu = script_window.Get(Am_UNDO_SCROLL_GROUP);
  Am_Value_List sel_list = scroll_menu.Get(Am_VALUE);
  if (sel_list.Valid() && sel_list.Length() > 1)
    return false;
  return true;
}